

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O1

void __thiscall
Lib::DArray<unsigned_int>::sortGen<false,BoostWrapper<FreqComparator<true,OccurenceTiebreak>>>
          (DArray<unsigned_int> *this,BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_> comp)

{
  uint s2;
  uint uVar1;
  uint *puVar2;
  bool bVar3;
  result_type_conflict1 rVar4;
  Comparison CVar5;
  int iVar6;
  unsigned_long *puVar7;
  uint aux;
  ulong uVar8;
  unsigned_long *res;
  unsigned_long s;
  ulong uVar9;
  ulong local_58;
  SymbolComparator local_4c;
  long local_48;
  uniform_int_distribution<int> local_40;
  unsigned_long local_38;
  
  if (1 < this->_size) {
    local_4c = comp.super_SymbolComparator._symType;
    if ((sortGen<false,BoostWrapper<FreqComparator<true,OccurenceTiebreak>>>(BoostWrapper<FreqComparator<true,OccurenceTiebreak>>)
         ::ft == '\0') &&
       (iVar6 = __cxa_guard_acquire(&sortGen<false,BoostWrapper<FreqComparator<true,OccurenceTiebreak>>>(BoostWrapper<FreqComparator<true,OccurenceTiebreak>>)
                                     ::ft), iVar6 != 0)) {
      sortGen<false,_BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_>_>::ft._size = 0x20;
      sortGen<false,_BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_>_>::ft._capacity = 0x20;
      puVar7 = (unsigned_long *)::operator_new(0x100,0x10);
      if (sortGen<false,_BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_>_>::ft._capacity != 0
         ) {
        memset(puVar7,0,sortGen<false,_BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_>_>::ft.
                        _capacity << 3);
      }
      sortGen<false,_BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_>_>::ft._array = puVar7;
      __cxa_atexit(DArray<unsigned_long>::~DArray,
                   &sortGen<false,_BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_>_>::ft,
                   &__dso_handle);
      __cxa_guard_release(&sortGen<false,BoostWrapper<FreqComparator<true,OccurenceTiebreak>>>(BoostWrapper<FreqComparator<true,OccurenceTiebreak>>)
                           ::ft);
    }
    s = this->_size - 1;
    DArray<unsigned_long>::ensure
              (&sortGen<false,_BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_>_>::ft,s);
    local_48 = 0;
    local_58 = 0;
    do {
      local_40._M_param._M_b = (int)s - (int)local_58;
      local_40._M_param._M_a = 0;
      rVar4 = std::uniform_int_distribution<int>::operator()
                        (&local_40,&Random::_eng,&local_40._M_param);
      uVar8 = (long)rVar4 + local_58;
      s2 = this->_array[uVar8];
      uVar9 = local_58;
      local_38 = s;
      if (local_58 < uVar8) {
        do {
          CVar5 = BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_>::compare
                            ((BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_> *)&local_4c,
                             this->_array[uVar9],s2);
          if ((uint)(CVar5 + GREATER) < 2) {
            uVar9 = uVar9 + 1;
          }
          else if (CVar5 == GREATER) {
            puVar2 = this->_array;
            uVar1 = puVar2[uVar9];
            if (uVar8 == s) {
              puVar2[uVar8] = uVar1;
              puVar2[uVar9] = puVar2[uVar8 - 1];
              puVar2[uVar8 - 1] = s2;
              uVar8 = uVar8 - 1;
            }
            else {
              puVar2[uVar9] = puVar2[s];
              puVar2[s] = uVar1;
            }
            s = s - 1;
          }
        } while (uVar9 < uVar8);
      }
      while (puVar7 = sortGen<false,_BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_>_>::ft.
                      _array, uVar8 < s) {
        CVar5 = BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_>::compare
                          ((BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_> *)&local_4c,s2,
                           this->_array[uVar8 + 1]);
        if ((uint)CVar5 < 2) {
          puVar2 = this->_array;
          puVar2[uVar8] = puVar2[uVar8 + 1];
          puVar2[uVar8 + 1] = s2;
          uVar8 = uVar8 + 1;
        }
        else if (CVar5 == LESS) {
          puVar2 = this->_array;
          uVar1 = puVar2[s];
          puVar2[s] = puVar2[uVar8 + 1];
          puVar2[uVar8 + 1] = uVar1;
          s = s - 1;
        }
      }
      if (uVar8 + 1 < local_38) {
        sortGen<false,_BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_>_>::ft._array[local_48]
             = uVar8 + 1;
        puVar7[local_48 + 1] = local_38;
        local_48 = local_48 + 2;
      }
      s = uVar8 - 1;
      bVar3 = true;
      if (uVar8 == 0 || s <= local_58) {
        if (local_48 == 0) {
          local_48 = 0;
          bVar3 = false;
        }
        else {
          local_58 = sortGen<false,_BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_>_>::ft.
                     _array[local_48 + -2];
          s = sortGen<false,_BoostWrapper<FreqComparator<true,_OccurenceTiebreak>_>_>::ft._array
              [local_48 + -1];
          local_48 = local_48 + -2;
        }
      }
    } while (bVar3);
  }
  return;
}

Assistant:

void sortGen(Comparator comp)
  {
    if(_size <= 1) {
      return;
    }

    // array behaves as a stack of calls to quicksort
    static DArray<size_t> ft(32);

    size_t from = 0;
    size_t to=size()-1;
    ft.ensure(to);

    size_t p = 0; // pointer to the next element in ft
    for (;;) {
      ASS(from<size() && to<size()); //checking for underflows
      ASS(from<to);
      // invariant: from < to
      size_t m = from + Random::getInteger(to-from+1);
      C mid = (*this)[m];
      size_t l = from;
      size_t r = to;
      while (l < m) {
        switch ((Inversed?-1:1)*comp.compare((*this)[l],mid))
  	{
  	case EQUAL:
  	case LESS:
  	  l++;
  	  break;
  	case GREATER:
  	  if (m == r) {
  	    (*this)[m] = (*this)[l];
  	    (*this)[l] = (*this)[m-1];
  	    (*this)[m-1] = mid;
  	    m--;
  	    r--;
  	  }
  	  else {
  	    ASS(m < r);
  	    C aux = (*this)[l];
  	    (*this)[l] = (*this)[r];
  	    (*this)[r] = aux;
  	    r--;
  	  }
  	  break;
  	}
      }
      // l == m
      // now literals in lits[from ... m-1] are smaller than lits[m]
      // and literals in lits[r+1 ... to] are greater than lits[m]
      while (m < r) {
        switch ((Inversed?-1:1)*comp.compare(mid,(*this)[m+1]))
  	{
  	case LESS:
  	  {
  	    C aux = (*this)[r];
  	    (*this)[r] = (*this)[m+1];
  	    (*this)[m+1] = aux;
  	    r--;
  	  }
  	  break;
  	case EQUAL:
  	case GREATER:
  	  (*this)[m] = (*this)[m+1];
  	  (*this)[m+1] = mid;
  	  m++;
  	}
      }
      // now literals in lits[from ... m-1] are smaller than lits[m]
      // and all literals in lits[m+1 ... to] are greater than lits[m]
      if (m+1 < to) {
        ft[p++] = m+1;
        ft[p++] = to;
      }

      to = m-1;
      if (m!=0 && from < to) {
        continue;
      }
      if (p != 0) {
        p -= 2;
        ASS(p >= 0);
        from = ft[p];
        to = ft[p+1];
        continue;
      }
      return;
    }
  }